

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngwutil.c
# Opt level: O0

void png_write_iTXt(png_structrp png_ptr,int compression,png_const_charp key,png_const_charp lang,
                   png_const_charp lang_key,png_const_charp text)

{
  bool bVar1;
  png_uint_32 pVar2;
  uint uVar3;
  int iVar4;
  size_t sVar5;
  ulong length;
  ulong length_00;
  undefined1 local_4c0 [8];
  compression_state comp;
  png_byte new_key [82];
  size_t lang_key_len;
  size_t lang_len;
  png_uint_32 prefix_len;
  png_uint_32 key_len;
  png_const_charp text_local;
  png_const_charp lang_key_local;
  png_const_charp lang_local;
  png_const_charp key_local;
  int compression_local;
  png_structrp png_ptr_local;
  
  pVar2 = png_check_keyword(png_ptr,key,comp.output + 0x3fc);
  if (pVar2 == 0) {
    png_error(png_ptr,"iTXt: invalid keyword");
  }
  switch(compression) {
  case 0:
  case 2:
    new_key[(ulong)(pVar2 + 1) - 8] = '\x01';
    bVar1 = true;
    break;
  case -1:
  case 1:
    new_key[(ulong)(pVar2 + 1) - 8] = '\0';
    bVar1 = false;
    break;
  default:
    png_error(png_ptr,"iTXt: invalid compression");
  }
  new_key[(ulong)(pVar2 + 2) - 8] = '\0';
  uVar3 = pVar2 + 3;
  lang_key_local = lang;
  if (lang == (png_const_charp)0x0) {
    lang_key_local = "";
  }
  sVar5 = strlen(lang_key_local);
  length = sVar5 + 1;
  text_local = lang_key;
  if (lang_key == (png_const_charp)0x0) {
    text_local = "";
  }
  sVar5 = strlen(text_local);
  length_00 = sVar5 + 1;
  _prefix_len = (png_const_bytep)text;
  if (text == (png_const_charp)0x0) {
    _prefix_len = "";
  }
  if (0x7fffffff - uVar3 < length) {
    lang_len._0_4_ = 0x7fffffff;
  }
  else {
    lang_len._0_4_ = uVar3 + (int)length;
  }
  if (0x7fffffff - (png_uint_32)lang_len < length_00) {
    lang_len._0_4_ = 0x7fffffff;
  }
  else {
    lang_len._0_4_ = (png_uint_32)lang_len + (int)length_00;
  }
  sVar5 = strlen((char *)_prefix_len);
  png_text_compress_init((compression_state *)local_4c0,_prefix_len,sVar5);
  if (bVar1) {
    iVar4 = png_text_compress(png_ptr,0x69545874,(compression_state *)local_4c0,
                              (png_uint_32)lang_len);
    if (iVar4 != 0) {
      png_error(png_ptr,(png_ptr->zstream).msg);
    }
  }
  else {
    if ((png_const_bytep)(ulong)(0x7fffffff - (png_uint_32)lang_len) < comp.input) {
      png_error(png_ptr,"iTXt: uncompressed text too long");
    }
    comp.input_len._0_4_ = (uint)comp.input;
  }
  png_write_chunk_header(png_ptr,0x69545874,(uint)comp.input_len + (png_uint_32)lang_len);
  png_write_chunk_data(png_ptr,comp.output + 0x3fc,(ulong)uVar3);
  png_write_chunk_data(png_ptr,(png_const_bytep)lang_key_local,length);
  png_write_chunk_data(png_ptr,(png_const_bytep)text_local,length_00);
  if (bVar1) {
    png_write_compressed_data_out(png_ptr,(compression_state *)local_4c0);
  }
  else {
    png_write_chunk_data(png_ptr,_prefix_len,(ulong)(uint)comp.input_len);
  }
  png_write_chunk_end(png_ptr);
  return;
}

Assistant:

void /* PRIVATE */
png_write_iTXt(png_structrp png_ptr, int compression, png_const_charp key,
    png_const_charp lang, png_const_charp lang_key, png_const_charp text)
{
   png_uint_32 key_len, prefix_len;
   size_t lang_len, lang_key_len;
   png_byte new_key[82];
   compression_state comp;

   png_debug(1, "in png_write_iTXt");

   key_len = png_check_keyword(png_ptr, key, new_key);

   if (key_len == 0)
      png_error(png_ptr, "iTXt: invalid keyword");

   /* Set the compression flag */
   switch (compression)
   {
      case PNG_ITXT_COMPRESSION_NONE:
      case PNG_TEXT_COMPRESSION_NONE:
         compression = new_key[++key_len] = 0; /* no compression */
         break;

      case PNG_TEXT_COMPRESSION_zTXt:
      case PNG_ITXT_COMPRESSION_zTXt:
         compression = new_key[++key_len] = 1; /* compressed */
         break;

      default:
         png_error(png_ptr, "iTXt: invalid compression");
   }

   new_key[++key_len] = PNG_COMPRESSION_TYPE_BASE;
   ++key_len; /* for the keywod separator */

   /* We leave it to the application to meet PNG-1.0 requirements on the
    * contents of the text.  PNG-1.0 through PNG-1.2 discourage the use of
    * any non-Latin-1 characters except for NEWLINE.  ISO PNG, however,
    * specifies that the text is UTF-8 and this really doesn't require any
    * checking.
    *
    * The NUL character is forbidden by PNG-1.0 through PNG-1.2 and ISO PNG.
    *
    * TODO: validate the language tag correctly (see the spec.)
    */
   if (lang == NULL) lang = ""; /* empty language is valid */
   lang_len = strlen(lang)+1;
   if (lang_key == NULL) lang_key = ""; /* may be empty */
   lang_key_len = strlen(lang_key)+1;
   if (text == NULL) text = ""; /* may be empty */

   prefix_len = key_len;
   if (lang_len > PNG_UINT_31_MAX-prefix_len)
      prefix_len = PNG_UINT_31_MAX;
   else
      prefix_len = (png_uint_32)(prefix_len + lang_len);

   if (lang_key_len > PNG_UINT_31_MAX-prefix_len)
      prefix_len = PNG_UINT_31_MAX;
   else
      prefix_len = (png_uint_32)(prefix_len + lang_key_len);

   png_text_compress_init(&comp, (png_const_bytep)text, strlen(text));

   if (compression != 0)
   {
      if (png_text_compress(png_ptr, png_iTXt, &comp, prefix_len) != Z_OK)
         png_error(png_ptr, png_ptr->zstream.msg);
   }

   else
   {
      if (comp.input_len > PNG_UINT_31_MAX-prefix_len)
         png_error(png_ptr, "iTXt: uncompressed text too long");

      /* So the string will fit in a chunk: */
      comp.output_len = (png_uint_32)/*SAFE*/comp.input_len;
   }

   png_write_chunk_header(png_ptr, png_iTXt, comp.output_len + prefix_len);

   png_write_chunk_data(png_ptr, new_key, key_len);

   png_write_chunk_data(png_ptr, (png_const_bytep)lang, lang_len);

   png_write_chunk_data(png_ptr, (png_const_bytep)lang_key, lang_key_len);

   if (compression != 0)
      png_write_compressed_data_out(png_ptr, &comp);

   else
      png_write_chunk_data(png_ptr, (png_const_bytep)text, comp.output_len);

   png_write_chunk_end(png_ptr);
}